

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

Territory __thiscall QTimeZonePrivate::territory(QTimeZonePrivate *this)

{
  undefined1 *puVar1;
  long lVar2;
  bool bVar3;
  Territory TVar4;
  char *pcVar5;
  long lVar6;
  long in_FS_OFFSET;
  QLatin1StringView rhs;
  QLatin1StringView lhs;
  iterator __begin2;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar5 = (this->m_id).d.ptr;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = &QByteArray::_empty;
  }
  puVar1 = (undefined1 *)(this->m_id).d.size;
  lVar6 = 0;
  do {
    local_58.m_haystack.m_data = "Asia/Kabul" + *(ushort *)((long)&DAT_00596274 + lVar6);
    local_58.m_haystack.m_size = -1;
    do {
      lVar2 = local_58.m_haystack.m_size + (ulong)*(ushort *)((long)&DAT_00596274 + lVar6) + 1;
      local_58.m_haystack.m_size = local_58.m_haystack.m_size + 1;
    } while ("Asia/Kabul"[lVar2] != '\0');
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_58.m_needle.ucs = L' ';
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)local_98,&local_58);
    if (local_98[0x18] == true) {
      do {
        if ((undefined1 *)local_98._8_8_ == puVar1) {
          rhs.m_data = pcVar5;
          rhs.m_size = (qsizetype)puVar1;
          lhs.m_data = (char *)local_98._16_8_;
          lhs.m_size = (qsizetype)puVar1;
          bVar3 = QtPrivate::equalStrings(lhs,rhs);
          if (bVar3) {
            TVar4 = *(Territory *)((long)&DAT_00596272 + lVar6);
            goto LAB_003f39f4;
          }
        }
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_98);
      } while (local_98[0x18] != false);
    }
    lVar6 = lVar6 + 6;
  } while (lVar6 != 0x876);
  TVar4 = AnyCountry;
LAB_003f39f4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return TVar4;
  }
  __stack_chk_fail();
}

Assistant:

QLocale::Territory QTimeZonePrivate::territory() const
{
    // Default fall-back mode, use the zoneTable to find Region of known Zones
    const QLatin1StringView sought(m_id.data(), m_id.size());
    for (const ZoneData &data : zoneDataTable) {
        for (QLatin1StringView token : data.ids()) {
            if (token == sought)
                return QLocale::Territory(data.territory);
        }
    }
    return QLocale::AnyTerritory;
}